

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              int *cost_list,FULLPEL_MV *best_mv,FULLPEL_MV_STATS *best_mv_stats,
              FULLPEL_MV *second_best_mv)

{
  FULLPEL_MV FVar1;
  byte bVar2;
  byte bVar3;
  MV_COST_TYPE MVar4;
  aom_sad_fn_t p_Var5;
  buf_2d *pbVar6;
  buf_2d *pbVar7;
  uint8_t *puVar8;
  MESH_PATTERN *pMVar9;
  uint8_t *puVar10;
  MV *pMVar11;
  short sVar12;
  short sVar13;
  undefined8 *puVar14;
  FULLPEL_MV *this_mv;
  uint *puVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  ushort uVar23;
  undefined4 in_register_00000014;
  uint uVar24;
  ushort uVar25;
  ushort uVar26;
  search_site_config *psVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  ushort uVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  ulong uVar35;
  int i_1;
  FULLPEL_MV FVar36;
  uint8_t *puVar37;
  int iVar38;
  long lVar39;
  int i;
  bool bVar40;
  bool bVar41;
  FULLPEL_MV tmp_mv_ex;
  int num00;
  FULLPEL_MV tmp_best_mv;
  FULLPEL_MV_STATS tmp_mv_stats;
  int local_17c;
  uint local_178;
  FULLPEL_MV local_16c;
  FULLPEL_MV *local_168;
  ulong local_160;
  uint *local_158;
  FULLPEL_MV_STATS *local_150;
  uint local_144;
  search_site_config *local_140;
  FULLPEL_MV local_134;
  uint local_130;
  int local_12c;
  long local_128;
  FULLPEL_MV local_11c;
  ulong local_118;
  FULLPEL_MOTION_SEARCH_PARAMS local_110;
  
  local_160 = CONCAT44(in_register_00000014,step_param);
  local_118 = (ulong)ms_params->bsize;
  bVar2 = ms_params->search_method;
  lVar39 = (long)ms_params->is_intra_mode;
  uVar21 = ms_params->run_mesh_search;
  best_mv->row = -0x8000;
  best_mv->col = -0x8000;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    second_best_mv->row = -0x8000;
    second_best_mv->col = -0x8000;
  }
  if (cost_list != (int *)0x0) {
    cost_list[0] = 0x7fffffff;
    cost_list[1] = 0x7fffffff;
    cost_list[2] = 0x7fffffff;
    cost_list[3] = 0x7fffffff;
    cost_list[4] = 0x7fffffff;
  }
  uVar18 = (uint)bVar2;
  local_168 = best_mv;
  local_158 = (uint *)cost_list;
  local_150 = best_mv_stats;
  local_134 = start_mv;
  local_128 = lVar39;
  switch(bVar2) {
  case 0:
  case 1:
  case 2:
  case 3:
    local_140 = ms_params->search_sites;
    local_12c = 0;
    iVar38 = (int)start_mv >> 0x10;
    iVar20 = (ms_params->mv_limits).col_min;
    iVar19 = (ms_params->mv_limits).col_max;
    if (iVar38 < iVar19) {
      iVar19 = iVar38;
    }
    if (iVar38 < iVar20) {
      iVar19 = iVar20;
    }
    uVar17 = (uint)start_mv.row;
    uVar18 = (ms_params->mv_limits).row_max;
    if ((int)uVar17 < (int)uVar18) {
      uVar18 = uVar17;
    }
    uVar24 = (ms_params->mv_limits).row_min;
    if ((int)uVar17 < (int)uVar24) {
      uVar18 = uVar24;
    }
    pbVar6 = (ms_params->ms_buffers).ref;
    iVar20 = pbVar6->stride;
    local_178 = uVar18 & 0xffff;
    bVar3 = (ms_params->mv_cost_params).mv_cost_type;
    if (bVar3 < 4) {
      sVar32 = (short)uVar18 - (ms_params->mv_cost_params).full_ref_mv.row;
      uVar25 = sVar32 * 8;
      sVar28 = (short)iVar19 - (ms_params->mv_cost_params).full_ref_mv.col;
      uVar31 = sVar28 * 8;
      switch(bVar3) {
      case 0:
        uVar17 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar25] +
                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                          (ulong)((uint)(uVar31 != 0) * 4 + (uint)(uVar25 != 0) * 8)) +
                 (ms_params->mv_cost_params).mvcost[1][(short)uVar31]) *
                 (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
        break;
      case 1:
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar25;
        }
        uVar25 = sVar28 * -8;
        if ((short)(sVar28 * -8) < 0) {
          uVar25 = uVar31;
        }
        uVar17 = ((uint)uVar25 + (uint)uVar22) * 4;
        break;
      case 2:
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar25;
        }
        uVar25 = sVar28 * -8;
        if ((short)(sVar28 * -8) < 0) {
          uVar25 = uVar31;
        }
        uVar17 = ((uint)uVar25 + (uint)uVar22) * 0xf >> 3;
        break;
      case 3:
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar25;
        }
        uVar25 = sVar28 * -8;
        if ((short)(sVar28 * -8) < 0) {
          uVar25 = uVar31;
        }
        uVar17 = (uint)uVar25 + (uint)uVar22;
      }
    }
    else {
      uVar17 = 0;
    }
    FVar1 = (FULLPEL_MV)(local_178 + iVar19 * 0x10000);
    pbVar7 = (ms_params->ms_buffers).src;
    puVar37 = pbVar6->buf + ((int)(short)iVar19 + (short)uVar18 * iVar20);
    puVar8 = (ms_params->ms_buffers).second_pred;
    local_130 = (uint)bVar2;
    local_144 = uVar21;
    if (puVar8 == (uint8_t *)0x0) {
      uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,puVar37,iVar20);
    }
    else {
      puVar10 = (ms_params->ms_buffers).mask;
      if (puVar10 == (uint8_t *)0x0) {
        uVar21 = (*ms_params->vfp->sdaf)(pbVar7->buf,pbVar7->stride,puVar37,iVar20,puVar8);
      }
      else {
        uVar21 = (*ms_params->vfp->msdf)
                           (pbVar7->buf,pbVar7->stride,puVar37,iVar20,puVar8,puVar10,
                            (ms_params->ms_buffers).mask_stride,(ms_params->ms_buffers).inv_mask);
      }
    }
    this_mv = local_168;
    uVar18 = (uint)local_160;
    diamond_search_sad(FVar1,uVar21 + uVar17,ms_params,uVar18,(int *)&local_16c,local_168,
                       second_best_mv);
    local_17c = get_mvpred_compound_var_cost(ms_params,this_mv,local_150);
    iVar20 = ~uVar18 + local_140->num_search_steps;
    if ((int)local_16c < iVar20) {
      FVar36 = local_16c;
      do {
        diamond_search_sad(FVar1,uVar21 + uVar17,ms_params,(int)FVar36 + (int)local_160 + 1,
                           &local_12c,&local_11c,second_best_mv);
        iVar19 = get_mvpred_compound_var_cost(ms_params,&local_11c,(FULLPEL_MV_STATS *)&local_110);
        if (iVar19 < local_17c) {
          *local_168 = local_11c;
          local_150->sse = (uint)local_110.vfp;
          local_150->err_cost = local_110._0_4_;
          local_150->distortion = local_110._4_4_;
          local_17c = iVar19;
        }
        FVar36 = (FULLPEL_MV)((int)FVar36 + 1);
        if (local_12c != 0) {
          FVar36 = (FULLPEL_MV)(local_12c + (int)FVar36);
          local_12c = 0;
        }
      } while ((int)FVar36 < iVar20);
    }
    puVar15 = local_158;
    lVar39 = local_128;
    start_mv = local_134;
    uVar18 = local_130;
    uVar21 = local_144;
    if (local_158 != (uint *)0x0) {
      FVar1 = *local_168;
      local_140 = (search_site_config *)(ulong)(uint)FVar1;
      pbVar6 = (ms_params->ms_buffers).ref;
      pbVar7 = (ms_params->ms_buffers).src;
      iVar20 = pbVar6->stride;
      iVar38 = (int)FVar1 >> 0x10;
      iVar19 = (int)FVar1.row;
      uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,pbVar6->buf + (iVar20 * iVar19 + iVar38)
                                 ,iVar20);
      puVar16 = local_158;
      *puVar15 = uVar21;
      sVar28 = FVar1.col;
      if (((((ms_params->mv_limits).row_min < iVar19) && (iVar19 < (ms_params->mv_limits).row_max))
          && ((ms_params->mv_limits).col_min < iVar38)) && (iVar38 < (ms_params->mv_limits).col_max)
         ) {
        lVar39 = 0;
        do {
          uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                     pbVar6->buf +
                                     ((int)(short)((&DAT_004db4b2)[lVar39 * 2] + sVar28) +
                                     (int)(short)((&calc_int_sad_list_neighbors)[lVar39 * 2] +
                                                 (short)local_140) * pbVar6->stride),iVar20);
          puVar16[lVar39 + 1] = uVar21;
          lVar39 = lVar39 + 1;
          psVar27 = local_140;
        } while (lVar39 != 4);
      }
      else {
        lVar39 = 0;
        psVar27 = local_140;
        do {
          iVar19 = (int)(short)((&DAT_004db4b2)[lVar39 * 2] + sVar28);
          uVar21 = 0x7fffffff;
          if ((((ms_params->mv_limits).col_min <= iVar19) &&
              (iVar19 <= (ms_params->mv_limits).col_max)) &&
             ((iVar38 = (int)(short)((&calc_int_sad_list_neighbors)[lVar39 * 2] + (short)psVar27),
              (ms_params->mv_limits).row_min <= iVar38 && (iVar38 <= (ms_params->mv_limits).row_max)
              ))) {
            uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                       pbVar6->buf + (iVar38 * pbVar6->stride + iVar19),iVar20);
            psVar27 = local_140;
          }
          local_158[lVar39 + 1] = uVar21;
          lVar39 = lVar39 + 1;
        } while (lVar39 != 4);
      }
      bVar2 = (ms_params->mv_cost_params).mv_cost_type;
      sVar32 = (short)psVar27 - (ms_params->mv_cost_params).full_ref_mv.row;
      uVar31 = sVar32 * 8;
      sVar28 = sVar28 - (ms_params->mv_cost_params).full_ref_mv.col;
      uVar25 = sVar28 * 8;
      switch(bVar2) {
      case 0:
        uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                          (ulong)((uint)(uVar25 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                 (ms_params->mv_cost_params).mvcost[1][(short)uVar25]) *
                 (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
        break;
      case 1:
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar31;
        }
        uVar23 = sVar28 * -8;
        if ((short)(sVar28 * -8) < 0) {
          uVar23 = uVar25;
        }
        uVar21 = ((uint)uVar23 + (uint)uVar22) * 4;
        break;
      case 2:
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar31;
        }
        uVar23 = sVar28 * -8;
        if ((short)(sVar28 * -8) < 0) {
          uVar23 = uVar25;
        }
        uVar21 = ((uint)uVar23 + (uint)uVar22) * 0xf >> 3;
        break;
      case 3:
        uVar22 = sVar32 * -8;
        if ((short)(sVar32 * -8) < 0) {
          uVar22 = uVar31;
        }
        uVar23 = sVar28 * -8;
        if ((short)(sVar28 * -8) < 0) {
          uVar23 = uVar25;
        }
        uVar21 = (uint)uVar23 + (uint)uVar22;
        break;
      default:
        uVar21 = 0;
      }
      *local_158 = *local_158 + uVar21;
      if (local_158[1] != 0x7fffffff) {
        if (bVar2 < 4) {
          uVar22 = uVar25 - 8;
          switch(bVar2) {
          case 0:
            uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                      *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                              (ulong)((uint)(uVar22 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                     (ms_params->mv_cost_params).mvcost[1][(short)uVar22]) *
                     (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
            break;
          case 1:
            uVar23 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar23 = uVar31;
            }
            uVar26 = -uVar22;
            if (0 < (short)uVar22) {
              uVar26 = uVar22;
            }
            uVar21 = ((uint)uVar26 + (uint)uVar23) * 4;
            break;
          case 2:
            uVar23 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar23 = uVar31;
            }
            uVar26 = -uVar22;
            if (0 < (short)uVar22) {
              uVar26 = uVar22;
            }
            uVar21 = ((uint)uVar26 + (uint)uVar23) * 0xf >> 3;
            break;
          case 3:
            uVar23 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar23 = uVar31;
            }
            uVar26 = -uVar22;
            if (0 < (short)uVar22) {
              uVar26 = uVar22;
            }
            uVar21 = (uint)uVar26 + (uint)uVar23;
          }
        }
        else {
          uVar21 = 0;
        }
        local_158[1] = uVar21 + local_158[1];
      }
      if (local_158[2] != 0x7fffffff) {
        if (bVar2 < 4) {
          uVar22 = uVar31 + 8;
          switch(bVar2) {
          case 0:
            uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar22] +
                      *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                              (ulong)((uint)(uVar25 != 0) * 4 + (uint)(uVar22 != 0) * 8)) +
                     (ms_params->mv_cost_params).mvcost[1][(short)uVar25]) *
                     (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
            break;
          case 1:
            uVar23 = -uVar22;
            if (0 < (short)uVar22) {
              uVar23 = uVar22;
            }
            uVar22 = sVar28 * -8;
            if ((short)(sVar28 * -8) < 0) {
              uVar22 = uVar25;
            }
            uVar21 = ((uint)uVar22 + (uint)uVar23) * 4;
            break;
          case 2:
            uVar23 = -uVar22;
            if (0 < (short)uVar22) {
              uVar23 = uVar22;
            }
            uVar22 = sVar28 * -8;
            if ((short)(sVar28 * -8) < 0) {
              uVar22 = uVar25;
            }
            uVar21 = ((uint)uVar22 + (uint)uVar23) * 0xf >> 3;
            break;
          case 3:
            uVar23 = -uVar22;
            if (0 < (short)uVar22) {
              uVar23 = uVar22;
            }
            uVar22 = sVar28 * -8;
            if ((short)(sVar28 * -8) < 0) {
              uVar22 = uVar25;
            }
            uVar21 = (uint)uVar22 + (uint)uVar23;
          }
        }
        else {
          uVar21 = 0;
        }
        local_158[2] = uVar21 + local_158[2];
      }
      if (local_158[3] != 0x7fffffff) {
        if (bVar2 < 4) {
          uVar22 = uVar25 + 8;
          switch(bVar2) {
          case 0:
            uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                      *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                              (ulong)((uint)(uVar22 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                     (ms_params->mv_cost_params).mvcost[1][(short)uVar22]) *
                     (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
            break;
          case 1:
            uVar23 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar23 = uVar31;
            }
            uVar26 = -uVar22;
            if (0 < (short)uVar22) {
              uVar26 = uVar22;
            }
            uVar21 = ((uint)uVar26 + (uint)uVar23) * 4;
            break;
          case 2:
            uVar23 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar23 = uVar31;
            }
            uVar26 = -uVar22;
            if (0 < (short)uVar22) {
              uVar26 = uVar22;
            }
            uVar21 = ((uint)uVar26 + (uint)uVar23) * 0xf >> 3;
            break;
          case 3:
            uVar23 = sVar32 * -8;
            if ((short)(sVar32 * -8) < 0) {
              uVar23 = uVar31;
            }
            uVar26 = -uVar22;
            if (0 < (short)uVar22) {
              uVar26 = uVar22;
            }
            uVar21 = (uint)uVar26 + (uint)uVar23;
          }
        }
        else {
          uVar21 = 0;
        }
        local_158[3] = uVar21 + local_158[3];
      }
      lVar39 = local_128;
      start_mv = local_134;
      uVar18 = local_130;
      uVar21 = local_144;
      if (local_158[4] != 0x7fffffff) {
        if (bVar2 < 4) {
          uVar31 = uVar31 - 8;
          switch(bVar2) {
          case 0:
            uVar17 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                      *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                              (ulong)((uint)(uVar25 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                     (ms_params->mv_cost_params).mvcost[1][(short)uVar25]) *
                     (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
            break;
          case 1:
            uVar22 = -uVar31;
            if (0 < (short)uVar31) {
              uVar22 = uVar31;
            }
            uVar31 = sVar28 * -8;
            if ((short)(sVar28 * -8) < 0) {
              uVar31 = uVar25;
            }
            uVar17 = ((uint)uVar31 + (uint)uVar22) * 4;
            break;
          case 2:
            uVar22 = -uVar31;
            if (0 < (short)uVar31) {
              uVar22 = uVar31;
            }
            uVar31 = sVar28 * -8;
            if ((short)(sVar28 * -8) < 0) {
              uVar31 = uVar25;
            }
            uVar17 = ((uint)uVar31 + (uint)uVar22) * 0xf >> 3;
            break;
          case 3:
            uVar22 = -uVar31;
            if (0 < (short)uVar31) {
              uVar22 = uVar31;
            }
            uVar31 = sVar28 * -8;
            if ((short)(sVar28 * -8) < 0) {
              uVar31 = uVar25;
            }
            uVar17 = (uint)uVar31 + (uint)uVar22;
          }
        }
        else {
          uVar17 = 0;
        }
        local_158[4] = uVar17 + local_158[4];
      }
    }
    goto LAB_001cd912;
  case 4:
  case 5:
  case 6:
    iVar20 = 1;
    goto LAB_001cd8fc;
  case 7:
  case 8:
    bVar41 = SBORROW4(step_param,10);
    bVar40 = step_param + -10 < 0;
    iVar20 = 9;
    break;
  case 9:
    bVar41 = SBORROW4(step_param,9);
    bVar40 = step_param + -9 < 0;
    iVar20 = 8;
    break;
  case 10:
    bVar41 = SBORROW4(step_param,0xb);
    bVar40 = step_param + -0xb < 0;
    iVar20 = 10;
    break;
  default:
    local_17c = 0;
    goto LAB_001cd912;
  }
  if (bVar41 == bVar40) {
    iVar20 = step_param;
  }
  step_param = iVar20;
  iVar20 = 0;
LAB_001cd8fc:
  local_17c = pattern_search(start_mv,ms_params,step_param,iVar20,cost_list,best_mv,best_mv_stats);
LAB_001cd912:
  if (((uVar21 == 0) && (uVar21 = 0, (byte)((char)uVar18 - 1U) < 2)) &&
     ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0)) {
    uVar21 = (uint)(ms_params->force_mesh_thresh >> (10 - (""[local_118] + ""[local_118]) & 0x1f) <
                   local_17c);
  }
  if (((int)lVar39 == 0) && (ms_params->prune_mesh_search != 0)) {
    uVar17 = (int)start_mv.row - (int)local_168->row;
    uVar18 = -uVar17;
    if (0 < (int)uVar17) {
      uVar18 = uVar17;
    }
    uVar24 = ((int)start_mv >> 0x10) - (int)local_168->col;
    uVar17 = -uVar24;
    if (0 < (int)uVar24) {
      uVar17 = uVar24;
    }
    if (uVar17 < uVar18) {
      uVar17 = uVar18;
    }
    if ((int)uVar17 <= ms_params->mesh_search_mv_diff_threshold) {
      uVar21 = 0;
    }
  }
  p_Var5 = ms_params->vfp->sdf;
  if (ms_params->sdf != p_Var5) {
    pbVar6 = (ms_params->ms_buffers).ref;
    pbVar7 = (ms_params->ms_buffers).src;
    iVar20 = pbVar7->stride;
    iVar19 = pbVar6->stride;
    puVar8 = pbVar7->buf;
    puVar37 = pbVar6->buf + (long)local_168->row * (long)iVar19 + (long)local_168->col;
    local_144 = uVar21;
    uVar18 = (*p_Var5)(puVar8,iVar20,puVar37,iVar19);
    lVar39 = local_128;
    uVar21 = local_144;
    uVar17 = (*ms_params->vfp->sdsf)(puVar8,iVar20,puVar37,iVar19);
    if (1 << (""[local_118] + ""[local_118] & 0x1f) < (int)uVar18) {
      iVar19 = uVar17 - uVar18;
      iVar20 = -iVar19;
      if (0 < iVar19) {
        iVar20 = iVar19;
      }
      uVar17 = 1;
      if (1 < (int)uVar18) {
        uVar17 = uVar18;
      }
      if (uVar17 * 9 <= (uint)(iVar20 * 10)) {
        memcpy(&local_110,ms_params,0xe0);
        puVar14 = (undefined8 *)CONCAT44(local_110.vfp._4_4_,(uint)local_110.vfp);
        local_110.sdf = (aom_sad_fn_t)*puVar14;
        local_110.sdx4df = (aom_sad_multi_d_fn_t)puVar14[6];
        local_110.sdx3df = (aom_sad_multi_d_fn_t)puVar14[7];
        iVar20 = av1_full_pixel_search
                           (local_134,&local_110,(int)local_160,(int *)local_158,local_168,local_150
                            ,second_best_mv);
        return iVar20;
      }
    }
  }
  if (uVar21 != 0) {
    pMVar9 = ms_params->mesh_patterns[lVar39];
    local_16c = *local_168;
    uVar21 = pMVar9->range;
    uVar18 = pMVar9->interval;
    if (((0xffffff05 < uVar21 - 0x101) && (0 < (int)uVar18)) && ((int)uVar18 <= (int)uVar21)) {
      uVar25 = local_16c.row;
      uVar31 = -uVar25;
      if (0 < (short)uVar25) {
        uVar31 = uVar25;
      }
      uVar22 = local_16c.col;
      uVar25 = -uVar22;
      if (0 < (short)uVar22) {
        uVar25 = uVar22;
      }
      if (uVar25 < uVar31) {
        uVar25 = uVar31;
      }
      uVar17 = (uint)(uVar25 >> 2) + (uint)uVar25;
      if (uVar17 < uVar21) {
        uVar17 = uVar21;
      }
      uVar24 = 0x100;
      if (uVar17 < 0x100) {
        uVar24 = uVar17;
      }
      uVar21 = (uVar24 & 0xffff) / (uVar21 / uVar18 & 0xffff);
      if (uVar21 < uVar18) {
        uVar21 = uVar18;
      }
      uVar18 = 4;
      if (uVar21 < 4) {
        uVar18 = uVar21;
      }
      if (ms_params->fine_search_interval == 0) {
        uVar18 = uVar21;
      }
      iVar20 = exhaustive_mesh_search(local_16c,ms_params,uVar24,uVar18,&local_16c,second_best_mv);
      if ((7 < uVar17) && (1 < uVar18)) {
        lVar39 = 0;
        do {
          iVar20 = exhaustive_mesh_search
                             (local_16c,ms_params,pMVar9[lVar39 + 1].range,
                              pMVar9[lVar39 + 1].interval,&local_16c,second_best_mv);
          if (pMVar9[lVar39 + 1].interval == 1) break;
          bVar40 = lVar39 != 2;
          lVar39 = lVar39 + 1;
        } while (bVar40);
      }
      iVar19 = 0x7fffffff;
      if (iVar20 != 0x7fffffff) {
        iVar19 = (int)local_16c.row;
        iVar38 = (int)local_16c.col;
        pbVar6 = (ms_params->ms_buffers).src;
        pbVar7 = (ms_params->ms_buffers).ref;
        iVar20 = pbVar7->stride;
        local_110._4_4_ =
             (*ms_params->vfp->vf)
                       (pbVar6->buf,pbVar6->stride,pbVar7->buf + (iVar20 * iVar19 + iVar38),iVar20,
                        (uint *)&local_110.vfp);
        MVar4 = (ms_params->mv_cost_params).mv_cost_type;
        local_110._0_4_ = 0;
        if (MVar4 != '\x04') {
          pMVar11 = (ms_params->mv_cost_params).ref_mv;
          sVar28 = pMVar11->row;
          sVar32 = pMVar11->col;
          sVar12 = (short)(iVar19 << 3);
          sVar29 = sVar12 - sVar28;
          sVar13 = (short)(iVar38 << 3);
          sVar33 = sVar13 - sVar32;
          sVar30 = -sVar29;
          if (0 < sVar29) {
            sVar30 = sVar29;
          }
          sVar34 = -sVar33;
          if (0 < sVar33) {
            sVar34 = sVar33;
          }
          if (MVar4 == '\x03') {
            local_110._0_4_ = (int)sVar34 + (int)sVar30 >> 3;
          }
          else if (MVar4 == '\x01') {
            local_110._0_4_ = (int)sVar34 + (int)sVar30 >> 2;
          }
          else {
            local_110._0_4_ = 0;
            if (MVar4 == '\0') {
              local_110._0_4_ =
                   SUB84(((long)(ms_params->mv_cost_params).mvcost[1][sVar33] +
                          (long)(ms_params->mv_cost_params).mvcost[0][sVar29] +
                         (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                       (ulong)((uint)(sVar13 != sVar32) * 4 +
                                              (uint)(sVar12 != sVar28) * 8))) *
                         (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe,0);
            }
          }
        }
        iVar19 = local_110._4_4_ + local_110._0_4_;
      }
      if (local_158 != (uint *)0x0) {
        local_140 = (search_site_config *)CONCAT44(local_140._4_4_,iVar19);
        local_160 = (ulong)((uint)local_16c >> 0x10);
        pbVar6 = (ms_params->ms_buffers).ref;
        pbVar7 = (ms_params->ms_buffers).src;
        iVar20 = pbVar6->stride;
        iVar19 = (int)local_16c >> 0x10;
        sVar28 = local_16c.row;
        iVar38 = (int)sVar28;
        uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                   pbVar6->buf + (iVar20 * iVar38 + iVar19),iVar20);
        puVar15 = local_158;
        *local_158 = uVar21;
        if ((((ms_params->mv_limits).row_min < iVar38) && (iVar38 < (ms_params->mv_limits).row_max))
           && (((ms_params->mv_limits).col_min < iVar19 && (iVar19 < (ms_params->mv_limits).col_max)
               ))) {
          lVar39 = 0;
          do {
            uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                       pbVar6->buf +
                                       ((int)(short)((&DAT_004db4b2)[lVar39 * 2] + (short)local_160)
                                       + (int)(short)((&calc_int_sad_list_neighbors)[lVar39 * 2] +
                                                     sVar28) * pbVar6->stride),iVar20);
            puVar15[lVar39 + 1] = uVar21;
            lVar39 = lVar39 + 1;
            uVar35 = local_160;
          } while (lVar39 != 4);
        }
        else {
          lVar39 = 0;
          uVar35 = local_160;
          do {
            iVar19 = (int)(short)((&DAT_004db4b2)[lVar39 * 2] + (short)uVar35);
            uVar21 = 0x7fffffff;
            if (((((ms_params->mv_limits).col_min <= iVar19) &&
                 (iVar19 <= (ms_params->mv_limits).col_max)) &&
                (iVar38 = (int)(short)((&calc_int_sad_list_neighbors)[lVar39 * 2] + sVar28),
                (ms_params->mv_limits).row_min <= iVar38)) &&
               (iVar38 <= (ms_params->mv_limits).row_max)) {
              uVar21 = (*ms_params->sdf)(pbVar7->buf,pbVar7->stride,
                                         pbVar6->buf + (iVar38 * pbVar6->stride + iVar19),iVar20);
              uVar35 = local_160;
            }
            local_158[lVar39 + 1] = uVar21;
            lVar39 = lVar39 + 1;
          } while (lVar39 != 4);
        }
        bVar2 = (ms_params->mv_cost_params).mv_cost_type;
        sVar28 = sVar28 - (ms_params->mv_cost_params).full_ref_mv.row;
        uVar31 = sVar28 * 8;
        sVar32 = (short)uVar35 - (ms_params->mv_cost_params).full_ref_mv.col;
        uVar25 = sVar32 * 8;
        switch(bVar2) {
        case 0:
          uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                    *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                            (ulong)((uint)(uVar25 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                   (ms_params->mv_cost_params).mvcost[1][(short)uVar25]) *
                   (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
          break;
        case 1:
          uVar22 = sVar28 * -8;
          if ((short)(sVar28 * -8) < 0) {
            uVar22 = uVar31;
          }
          uVar23 = sVar32 * -8;
          if ((short)(sVar32 * -8) < 0) {
            uVar23 = uVar25;
          }
          uVar21 = ((uint)uVar23 + (uint)uVar22) * 4;
          break;
        case 2:
          uVar22 = sVar28 * -8;
          if ((short)(sVar28 * -8) < 0) {
            uVar22 = uVar31;
          }
          uVar23 = sVar32 * -8;
          if ((short)(sVar32 * -8) < 0) {
            uVar23 = uVar25;
          }
          uVar21 = ((uint)uVar23 + (uint)uVar22) * 0xf >> 3;
          break;
        case 3:
          uVar22 = sVar28 * -8;
          if ((short)(sVar28 * -8) < 0) {
            uVar22 = uVar31;
          }
          uVar23 = sVar32 * -8;
          if ((short)(sVar32 * -8) < 0) {
            uVar23 = uVar25;
          }
          uVar21 = (uint)uVar23 + (uint)uVar22;
          break;
        default:
          uVar21 = 0;
        }
        *local_158 = *local_158 + uVar21;
        if (local_158[1] != 0x7fffffff) {
          if (bVar2 < 4) {
            uVar22 = uVar25 - 8;
            switch(bVar2) {
            case 0:
              uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(uVar22 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][(short)uVar22]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              uVar23 = sVar28 * -8;
              if ((short)(sVar28 * -8) < 0) {
                uVar23 = uVar31;
              }
              uVar26 = -uVar22;
              if (0 < (short)uVar22) {
                uVar26 = uVar22;
              }
              uVar21 = ((uint)uVar26 + (uint)uVar23) * 4;
              break;
            case 2:
              uVar23 = sVar28 * -8;
              if ((short)(sVar28 * -8) < 0) {
                uVar23 = uVar31;
              }
              uVar26 = -uVar22;
              if (0 < (short)uVar22) {
                uVar26 = uVar22;
              }
              uVar21 = ((uint)uVar26 + (uint)uVar23) * 0xf >> 3;
              break;
            case 3:
              uVar23 = sVar28 * -8;
              if ((short)(sVar28 * -8) < 0) {
                uVar23 = uVar31;
              }
              uVar26 = -uVar22;
              if (0 < (short)uVar22) {
                uVar26 = uVar22;
              }
              uVar21 = (uint)uVar26 + (uint)uVar23;
            }
          }
          else {
            uVar21 = 0;
          }
          local_158[1] = uVar21 + local_158[1];
        }
        if (local_158[2] != 0x7fffffff) {
          if (bVar2 < 4) {
            uVar22 = uVar31 + 8;
            switch(bVar2) {
            case 0:
              uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar22] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(uVar25 != 0) * 4 + (uint)(uVar22 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][(short)uVar25]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              uVar23 = -uVar22;
              if (0 < (short)uVar22) {
                uVar23 = uVar22;
              }
              uVar22 = sVar32 * -8;
              if ((short)(sVar32 * -8) < 0) {
                uVar22 = uVar25;
              }
              uVar21 = ((uint)uVar22 + (uint)uVar23) * 4;
              break;
            case 2:
              uVar23 = -uVar22;
              if (0 < (short)uVar22) {
                uVar23 = uVar22;
              }
              uVar22 = sVar32 * -8;
              if ((short)(sVar32 * -8) < 0) {
                uVar22 = uVar25;
              }
              uVar21 = ((uint)uVar22 + (uint)uVar23) * 0xf >> 3;
              break;
            case 3:
              uVar23 = -uVar22;
              if (0 < (short)uVar22) {
                uVar23 = uVar22;
              }
              uVar22 = sVar32 * -8;
              if ((short)(sVar32 * -8) < 0) {
                uVar22 = uVar25;
              }
              uVar21 = (uint)uVar22 + (uint)uVar23;
            }
          }
          else {
            uVar21 = 0;
          }
          local_158[2] = uVar21 + local_158[2];
        }
        if (local_158[3] != 0x7fffffff) {
          if (bVar2 < 4) {
            uVar22 = uVar25 + 8;
            switch(bVar2) {
            case 0:
              uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(uVar22 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][(short)uVar22]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              uVar23 = sVar28 * -8;
              if ((short)(sVar28 * -8) < 0) {
                uVar23 = uVar31;
              }
              uVar26 = -uVar22;
              if (0 < (short)uVar22) {
                uVar26 = uVar22;
              }
              uVar21 = ((uint)uVar26 + (uint)uVar23) * 4;
              break;
            case 2:
              uVar23 = sVar28 * -8;
              if ((short)(sVar28 * -8) < 0) {
                uVar23 = uVar31;
              }
              uVar26 = -uVar22;
              if (0 < (short)uVar22) {
                uVar26 = uVar22;
              }
              uVar21 = ((uint)uVar26 + (uint)uVar23) * 0xf >> 3;
              break;
            case 3:
              uVar23 = sVar28 * -8;
              if ((short)(sVar28 * -8) < 0) {
                uVar23 = uVar31;
              }
              uVar26 = -uVar22;
              if (0 < (short)uVar22) {
                uVar26 = uVar22;
              }
              uVar21 = (uint)uVar26 + (uint)uVar23;
            }
          }
          else {
            uVar21 = 0;
          }
          local_158[3] = uVar21 + local_158[3];
        }
        iVar19 = (int)local_140;
        if (local_158[4] != 0x7fffffff) {
          if (bVar2 < 4) {
            uVar31 = uVar31 - 8;
            switch(bVar2) {
            case 0:
              uVar21 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar31] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(uVar25 != 0) * 4 + (uint)(uVar31 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][(short)uVar25]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              uVar22 = -uVar31;
              if (0 < (short)uVar31) {
                uVar22 = uVar31;
              }
              uVar31 = sVar32 * -8;
              if ((short)(sVar32 * -8) < 0) {
                uVar31 = uVar25;
              }
              uVar21 = ((uint)uVar31 + (uint)uVar22) * 4;
              break;
            case 2:
              uVar22 = -uVar31;
              if (0 < (short)uVar31) {
                uVar22 = uVar31;
              }
              uVar31 = sVar32 * -8;
              if ((short)(sVar32 * -8) < 0) {
                uVar31 = uVar25;
              }
              uVar21 = ((uint)uVar31 + (uint)uVar22) * 0xf >> 3;
              break;
            case 3:
              uVar22 = -uVar31;
              if (0 < (short)uVar31) {
                uVar22 = uVar31;
              }
              uVar31 = sVar32 * -8;
              if ((short)(sVar32 * -8) < 0) {
                uVar31 = uVar25;
              }
              uVar21 = (uint)uVar31 + (uint)uVar22;
            }
          }
          else {
            uVar21 = 0;
          }
          local_158[4] = uVar21 + local_158[4];
        }
      }
      if (iVar19 < local_17c) {
        local_150->sse = (uint)local_110.vfp;
        local_150->err_cost = local_110._0_4_;
        local_150->distortion = local_110._4_4_;
        *local_168 = local_16c;
        local_17c = iVar19;
      }
    }
  }
  return local_17c;
}

Assistant:

int av1_full_pixel_search(const FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          const int step_param, int *cost_list,
                          FULLPEL_MV *best_mv, FULLPEL_MV_STATS *best_mv_stats,
                          FULLPEL_MV *second_best_mv) {
  const BLOCK_SIZE bsize = ms_params->bsize;
  const SEARCH_METHODS search_method = ms_params->search_method;

  const int is_intra_mode = ms_params->is_intra_mode;
  int run_mesh_search = ms_params->run_mesh_search;

  int var = 0;
  MARK_MV_INVALID(best_mv);
  if (second_best_mv) {
    MARK_MV_INVALID(second_best_mv);
  }

  if (cost_list) {
    cost_list[0] = INT_MAX;
    cost_list[1] = INT_MAX;
    cost_list[2] = INT_MAX;
    cost_list[3] = INT_MAX;
    cost_list[4] = INT_MAX;
  }

  assert(ms_params->ms_buffers.ref->stride == ms_params->search_sites->stride);

  switch (search_method) {
    case FAST_BIGDIA:
      var = fast_bigdia_search(start_mv, ms_params, step_param, 0, cost_list,
                               best_mv, best_mv_stats);
      break;
    case VFAST_DIAMOND:
      var = vfast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                             best_mv, best_mv_stats);
      break;
    case FAST_DIAMOND:
      var = fast_dia_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case FAST_HEX:
      var = fast_hex_search(start_mv, ms_params, step_param, 0, cost_list,
                            best_mv, best_mv_stats);
      break;
    case HEX:
      var = hex_search(start_mv, ms_params, step_param, 1, cost_list, best_mv,
                       best_mv_stats);
      break;
    case SQUARE:
      var = square_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case BIGDIA:
      var = bigdia_search(start_mv, ms_params, step_param, 1, cost_list,
                          best_mv, best_mv_stats);
      break;
    case NSTEP:
    case NSTEP_8PT:
    case DIAMOND:
    case CLAMPED_DIAMOND:
      var = full_pixel_diamond(start_mv, ms_params, step_param, cost_list,
                               best_mv, best_mv_stats, second_best_mv);
      break;
    default: assert(0 && "Invalid search method.");
  }

  // Should we allow a follow on exhaustive search?
  if (!run_mesh_search &&
      ((search_method == NSTEP) || (search_method == NSTEP_8PT)) &&
      !ms_params->ms_buffers.second_pred) {
    int exhaustive_thr = ms_params->force_mesh_thresh;
    exhaustive_thr >>=
        10 - (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    // Threshold variance for an exhaustive full search.
    if (var > exhaustive_thr) run_mesh_search = 1;
  }

  // TODO(yunqing): the following is used to reduce mesh search in temporal
  // filtering. Can extend it to intrabc.
  if (!is_intra_mode && ms_params->prune_mesh_search) {
    const int full_pel_mv_diff = AOMMAX(abs(start_mv.row - best_mv->row),
                                        abs(start_mv.col - best_mv->col));
    if (full_pel_mv_diff <= ms_params->mesh_search_mv_diff_threshold) {
      run_mesh_search = 0;
    }
  }

  if (ms_params->sdf != ms_params->vfp->sdf) {
    // If we are skipping rows when we perform the motion search, we need to
    // check the quality of skipping. If it's bad, then we run mesh search with
    // skip row features off.
    // TODO(chiyotsai@google.com): Handle the case where we have a vertical
    // offset of 1 before we hit this statement to avoid having to redo
    // motion search.
    const struct buf_2d *src = ms_params->ms_buffers.src;
    const struct buf_2d *ref = ms_params->ms_buffers.ref;
    const int src_stride = src->stride;
    const int ref_stride = ref->stride;

    const uint8_t *src_address = src->buf;
    const uint8_t *best_address = get_buf_from_fullmv(ref, best_mv);
    const int sad =
        ms_params->vfp->sdf(src_address, src_stride, best_address, ref_stride);
    const int skip_sad =
        ms_params->vfp->sdsf(src_address, src_stride, best_address, ref_stride);
    // We will keep the result of skipping rows if it's good enough. Here, good
    // enough means the error is less than 1 per pixel.
    const int kSADThresh =
        1 << (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
    if (sad > kSADThresh && abs(skip_sad - sad) * 10 >= AOMMAX(sad, 1) * 9) {
      // There is a large discrepancy between skipping and not skipping, so we
      // need to redo the motion search.
      FULLPEL_MOTION_SEARCH_PARAMS new_ms_params = *ms_params;
      new_ms_params.sdf = new_ms_params.vfp->sdf;
      new_ms_params.sdx4df = new_ms_params.vfp->sdx4df;
      new_ms_params.sdx3df = new_ms_params.vfp->sdx3df;

      return av1_full_pixel_search(start_mv, &new_ms_params, step_param,
                                   cost_list, best_mv, best_mv_stats,
                                   second_best_mv);
    }
  }

  if (run_mesh_search) {
    int var_ex;
    FULLPEL_MV tmp_mv_ex;
    FULLPEL_MV_STATS tmp_mv_stats;
    // Pick the mesh pattern for exhaustive search based on the toolset (intraBC
    // or non-intraBC)
    // TODO(chiyotsai@google.com):  There is a bug here where the second best mv
    // gets overwritten without actually comparing the rdcost.
    const MESH_PATTERN *const mesh_patterns =
        ms_params->mesh_patterns[is_intra_mode];
    // TODO(chiyotsai@google.com): the second best mv is not set correctly by
    // full_pixel_exhaustive, which can incorrectly override it.
    var_ex =
        full_pixel_exhaustive(*best_mv, ms_params, mesh_patterns, cost_list,
                              &tmp_mv_ex, &tmp_mv_stats, second_best_mv);
    if (var_ex < var) {
      var = var_ex;
      *best_mv_stats = tmp_mv_stats;
      *best_mv = tmp_mv_ex;
    }
  }

  return var;
}